

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

void absl::lts_20240722::debugging_internal::Append(State *state,char *str,size_t length)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  int iVar5;
  
  if (length != 0) {
    sVar4 = 0;
    do {
      iVar2 = (state->parse_state).out_cur_idx;
      iVar5 = iVar2 + 1;
      if (state->out_end_idx <= iVar5) {
        (state->parse_state).out_cur_idx = state->out_end_idx + 1;
        break;
      }
      cVar1 = str[sVar4];
      pcVar3 = state->out;
      (state->parse_state).out_cur_idx = iVar5;
      pcVar3[iVar2] = cVar1;
      sVar4 = sVar4 + 1;
    } while (length != sVar4);
  }
  iVar2 = (state->parse_state).out_cur_idx;
  if (iVar2 < state->out_end_idx) {
    state->out[iVar2] = '\0';
  }
  return;
}

Assistant:

static void Append(State *state, const char *const str, const size_t length) {
  for (size_t i = 0; i < length; ++i) {
    if (state->parse_state.out_cur_idx + 1 <
        state->out_end_idx) {  // +1 for '\0'
      state->out[state->parse_state.out_cur_idx++] = str[i];
    } else {
      // signal overflow
      state->parse_state.out_cur_idx = state->out_end_idx + 1;
      break;
    }
  }
  if (state->parse_state.out_cur_idx < state->out_end_idx) {
    state->out[state->parse_state.out_cur_idx] =
        '\0';  // Terminate it with '\0'
  }
}